

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

_Bool M68K_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                         uint64_t address,void *inst_info)

{
  cs_struct *pcVar1;
  uint uVar2;
  MCInst *in_RCX;
  ulong in_RDX;
  uint8_t *in_RSI;
  m68k_info *in_R8;
  uint64_t in_R9;
  m68k_info *info;
  cs_struct *handle;
  int cpu_type;
  int s;
  m68k_info *info_00;
  uint local_40;
  _Bool local_1;
  
  local_40 = 1;
  pcVar1 = in_RCX->csh;
  info_00 = (m68k_info *)pcVar1->printer_info;
  if (in_RDX < 2) {
    *(undefined2 *)&in_R8->code = 0;
    local_1 = false;
  }
  else {
    if (in_RCX->flat_insn->detail != (cs_detail *)0x0) {
      memset(in_RCX->flat_insn->detail,0,0x148);
    }
    info_00->groups_count = '\0';
    info_00->regs_read_count = '\0';
    info_00->regs_write_count = '\0';
    info_00->code = in_RSI;
    info_00->code_len = in_RDX;
    info_00->baseAddress = in_R9;
    if ((pcVar1->mode & CS_MODE_32) != CS_MODE_ARM) {
      local_40 = 2;
    }
    if ((pcVar1->mode & CS_MODE_64) != CS_MODE_ARM) {
      local_40 = 4;
    }
    if ((pcVar1->mode & CS_MODE_M680X_6801) != CS_MODE_ARM) {
      local_40 = 5;
    }
    if ((pcVar1->mode & CS_MODE_M680X_6805) != CS_MODE_ARM) {
      local_40 = 6;
    }
    if ((pcVar1->mode & CS_MODE_M680X_6808) != CS_MODE_ARM) {
      local_40 = 6;
    }
    m68k_setup_internals(info_00,in_RCX,(uint)in_R9,local_40);
    uVar2 = m68k_disassemble(in_R8,in_R9);
    if (uVar2 == 0) {
      *(undefined2 *)&in_R8->code = 2;
      local_1 = false;
    }
    else {
      build_regs_read_write_counts(info_00);
      if ((int)in_RDX < (int)uVar2) {
        *(short *)&in_R8->code = (short)in_RDX;
      }
      else {
        *(short *)&in_R8->code = (short)uVar2;
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool M68K_getInstruction(csh ud, const uint8_t* code, size_t code_len, MCInst* instr, uint16_t* size, uint64_t address, void* inst_info)
{
#ifdef M68K_DEBUG
	SStream ss;
#endif
	int s;
	int cpu_type = M68K_CPU_TYPE_68000;
	cs_struct* handle = instr->csh;
	m68k_info *info = (m68k_info*)handle->printer_info;

	// code len has to be at least 2 bytes to be valid m68k

	if (code_len < 2) {
		*size = 0;
		return false;
	}

	if (instr->flat_insn->detail) {
		memset(instr->flat_insn->detail, 0, offsetof(cs_detail, m68k)+sizeof(cs_m68k));
	}

	info->groups_count = 0;
	info->regs_read_count = 0;
	info->regs_write_count = 0;
	info->code = code;
	info->code_len = code_len;
	info->baseAddress = address;

	if (handle->mode & CS_MODE_M68K_010)
		cpu_type = M68K_CPU_TYPE_68010;
	if (handle->mode & CS_MODE_M68K_020)
		cpu_type = M68K_CPU_TYPE_68020;
	if (handle->mode & CS_MODE_M68K_030)
		cpu_type = M68K_CPU_TYPE_68030;
	if (handle->mode & CS_MODE_M68K_040)
		cpu_type = M68K_CPU_TYPE_68040;
	if (handle->mode & CS_MODE_M68K_060)
		cpu_type = M68K_CPU_TYPE_68040;	// 060 = 040 for now

	m68k_setup_internals(info, instr, (unsigned int)address, cpu_type);
	s = m68k_disassemble(info, address);

	if (s == 0) {
		*size = 2;
		return false;
	}

	build_regs_read_write_counts(info);

#ifdef M68K_DEBUG
	SStream_Init(&ss);
	M68K_printInst(instr, &ss, info);
#endif

	// Make sure we always stay within range
	if (s > (int)code_len)
		*size = (uint16_t)code_len;
	else
		*size = (uint16_t)s;

	return true;
}